

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.h
# Opt level: O1

CostType __thiscall wasm::CostAnalyzer::visitContBind(CostAnalyzer *this,ContBind *curr)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  CostType CVar4;
  
  uVar2 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->cont);
  CVar4 = uVar2 + 100;
  sVar1 = (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  if (sVar1 != 0) {
    uVar3 = 0;
    do {
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar3) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      uVar2 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                        ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,
                         (curr->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                         data[uVar3]);
      CVar4 = CVar4 + uVar2;
      uVar3 = uVar3 + 1;
    } while (sVar1 != uVar3);
  }
  return CVar4;
}

Assistant:

CostType visitContBind(ContBind* curr) {
    // cont.bind may need to allocate a buffer to hold the arguments.
    CostType ret = AllocationCost;
    ret += visit(curr->cont);
    for (auto* arg : curr->operands) {
      ret += visit(arg);
    }
    return ret;
  }